

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::post_action(NaPNStatistics *this)

{
  NaPetriCnInput *in_RDI;
  
  NaPetriCnInput::commit_data(in_RDI);
  if (((*(uint *)&in_RDI[5].super_NaPetriConnector.pcaLinked.field_0xc <=
        *(uint *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pHead) &&
      (*(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.field_0xc != 0)) ||
     (*(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.field_0xc == 0)) {
    NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x15287d);
  }
  return;
}

Assistant:

void
NaPNStatistics::post_action ()
{
  signal.commit_data();

  if(nGapAct >= nGapWidth && nGapWidth > 0
     || 0 == nGapWidth)
    // commit data each activations (continuous computation) or at the
    // end of each gap
    stat.commit_data();
}